

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_version_number.cpp
# Opt level: O0

uint ON_GetVersionQuartet
               (uint major_version,uint minor_version,uint year,uint month,uint day_of_month,
               uint hour,uint minute,uint branch,unsigned_short *quartet_values)

{
  uint local_2c;
  uint local_28;
  uint version_number;
  uint item_value;
  uint i;
  uint hour_local;
  uint day_of_month_local;
  uint month_local;
  uint year_local;
  uint minor_version_local;
  uint major_version_local;
  
  local_2c = ON_VersionNumberConstruct(major_version,minor_version,year,month,day_of_month,branch);
  item_value = hour;
  if ((0x17 < hour) || (0x3b < minute)) {
    if ((hour == 0x18) && (minute == 0)) {
      item_value = 0x17;
      minute = 0x3c;
    }
    if ((item_value != 0x17) || (minute != 0x3c)) {
      item_value = 0;
      minute = 0;
    }
  }
  version_number = 0;
  do {
    if (3 < version_number) {
      return local_2c;
    }
    switch(version_number) {
    case 0:
      local_28 = major_version;
      break;
    case 1:
      local_28 = minor_version;
      break;
    case 2:
      local_28 = ON_DayOfGregorianYear(year,month,day_of_month);
      local_28 = (year - 2000) * 1000 + local_28;
      break;
    case 3:
      local_28 = (item_value * 100 + minute) * 10 + branch;
      break;
    default:
      goto switchD_0097def1_default;
    }
    if (0xffff < local_28) {
      local_2c = 0;
      local_28 = 0;
    }
    quartet_values[version_number] = (unsigned_short)local_28;
switchD_0097def1_default:
    version_number = version_number + 1;
  } while( true );
}

Assistant:

unsigned int ON_GetVersionQuartet(
  unsigned int major_version,
  unsigned int minor_version,
  unsigned int year,
  unsigned int month,
  unsigned int day_of_month,
  unsigned int hour,
  unsigned int minute,
  unsigned int branch,
  unsigned short quartet_values[4]
  )
{
  unsigned int i;
  unsigned int item_value;
  unsigned int version_number = ON_VersionNumberConstruct(
                                      major_version,
                                      minor_version,
                                      year,
                                      month,
                                      day_of_month,
                                      branch
                                      );

  if ( hour >= 24 || minute >= 60 )
  {
    if ( 24 == hour && 0 == minute )
    {
      // leap second
      hour = 23;
      minute = 60;
    }
    if ( 23 != hour || 60 != minute )
    {
      hour = 0;
      minute = 0;
    }
  }

  for(i = 0; i < 4; i++ )
  {
    switch(i)
    {
    case 0:
      item_value = major_version;
      break;
    case 1:
      item_value = minor_version;
      break;
    case 2:
      item_value = (year-2000)*1000 + ON_DayOfGregorianYear(year,month,day_of_month);
      break;
    case 3:
      item_value = (hour*100 + minute)*10 + branch;
      break;
    default:
      continue;
      break;
    }

    if ( item_value > 0xFFFF )
    {
      version_number = 0;
      item_value = 0;
    }

    quartet_values[i] = (unsigned short)item_value;
  }

  return version_number;
}